

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O0

RefPtr<wabt::interp::Module> * __thiscall
wabt::interp::RefPtr<wabt::interp::Module>::operator=
          (RefPtr<wabt::interp::Module> *this,RefPtr<wabt::interp::Module> *other)

{
  RefPtr<wabt::interp::Module> *other_local;
  RefPtr<wabt::interp::Module> *this_local;
  
  this->obj_ = other->obj_;
  this->store_ = other->store_;
  this->root_index_ = other->root_index_;
  other->obj_ = (Module *)0x0;
  other->store_ = (Store *)0x0;
  other->root_index_ = 0;
  return this;
}

Assistant:

RefPtr<T>& RefPtr<T>::operator=(RefPtr&& other) {
  obj_ = other.obj_;
  store_ = other.store_;
  root_index_ = other.root_index_;
  other.obj_ = nullptr;
  other.store_ = nullptr;
  other.root_index_ = 0;
  return *this;
}